

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Vec_Flt_t * Scl_LibertyReadFloatVec(char *pName)

{
  uint uVar1;
  Vec_Flt_t *pVVar2;
  float *pfVar3;
  char *__nptr;
  long lVar4;
  uint uVar5;
  double dVar6;
  
  pVVar2 = (Vec_Flt_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  pfVar3 = (float *)malloc(400);
  pVVar2->pArray = pfVar3;
  __nptr = strtok(pName," \t\n\r\\\",");
  if (__nptr != (char *)0x0) {
    lVar4 = (long)pVVar2->nSize;
    uVar5 = pVVar2->nCap;
    pfVar3 = pVVar2->pArray;
    do {
      dVar6 = atof(__nptr);
      if ((uint)lVar4 == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (pfVar3 == (float *)0x0) {
            pfVar3 = (float *)malloc(0x40);
          }
          else {
            pfVar3 = (float *)realloc(pfVar3,0x40);
          }
          uVar5 = 0x10;
        }
        else {
          uVar1 = uVar5 * 2;
          if (SBORROW4(uVar5,uVar1) != 0 < (int)uVar5) {
            uVar5 = uVar1;
            if (pfVar3 == (float *)0x0) {
              pfVar3 = (float *)malloc((ulong)uVar1 << 2);
            }
            else {
              pfVar3 = (float *)realloc(pfVar3,(ulong)uVar1 << 2);
            }
          }
        }
      }
      pfVar3[lVar4] = (float)dVar6;
      lVar4 = lVar4 + 1;
      __nptr = strtok((char *)0x0," \t\n\r\\\",");
    } while (__nptr != (char *)0x0);
    pVVar2->nSize = (int)lVar4;
    pVVar2->nCap = uVar5;
    pVVar2->pArray = pfVar3;
  }
  return pVVar2;
}

Assistant:

Vec_Flt_t * Scl_LibertyReadFloatVec( char * pName )
{
    char * pToken;
    Vec_Flt_t * vValues = Vec_FltAlloc( 100 );
    for ( pToken = strtok(pName, " \t\n\r\\\","); pToken; pToken = strtok(NULL, " \t\n\r\\\",") )
        Vec_FltPush( vValues, atof(pToken) );
    return vValues;
}